

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

void __thiscall cmCTestHG::LogParser::~LogParser(LogParser *this)

{
  ~LogParser(this);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

~LogParser() override { this->CleanupParser(); }